

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_column.h
# Opt level: O2

Entry * __thiscall
Gudhi::persistence_matrix::
Vector_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>
::_insert_entry(Vector_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>
                *this,Field_element *value,ID_index rowIndex,Column_support *column)

{
  Entry *newEntry;
  ID_index local_34;
  Matrix_entry *local_30;
  
  local_34 = rowIndex;
  local_30 = New_entry_constructor<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>
             ::construct<unsigned_int&,unsigned_int&>
                       ((New_entry_constructor<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>
                         *)this->entryPool_,(uint *)this,&local_34);
  (local_30->super_Entry_field_element_option).element_ = *value;
  std::
  vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_*>_>
  ::push_back(column,&local_30);
  Row_access<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>
  ::insert_entry(&this->super_Row_access_option,local_34,local_30);
  return local_30;
}

Assistant:

inline typename Vector_column<Master_matrix>::Entry*
Vector_column<Master_matrix>::_insert_entry(const Field_element& value, ID_index rowIndex, Column_support& column)
{
  if constexpr (Master_matrix::Option_list::has_row_access) {
    Entry* newEntry = entryPool_->construct(RA_opt::columnIndex_, rowIndex);
    newEntry->set_element(value);
    column.push_back(newEntry);
    RA_opt::insert_entry(rowIndex, newEntry);
    return newEntry;
  } else {
    Entry* newEntry = entryPool_->construct(rowIndex);
    newEntry->set_element(value);
    column.push_back(newEntry);
    return newEntry;
  }
}